

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.h
# Opt level: O3

void __thiscall node::PSBTAnalysis::SetInvalid(PSBTAnalysis *this,string err_msg)

{
  long lVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->estimated_vsize).super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_engaged == true) {
    (this->estimated_vsize).super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_engaged = false;
  }
  if ((this->estimated_feerate).super__Optional_base<CFeeRate,_true,_true>._M_payload.
      super__Optional_payload_base<CFeeRate>._M_engaged == true) {
    (this->estimated_feerate).super__Optional_base<CFeeRate,_true,_true>._M_payload.
    super__Optional_payload_base<CFeeRate>._M_engaged = false;
  }
  if ((this->fee).super__Optional_base<long,_true,_true>._M_payload.
      super__Optional_payload_base<long>._M_engaged == true) {
    (this->fee).super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>
    ._M_engaged = false;
  }
  std::vector<node::PSBTInputAnalysis,_std::allocator<node::PSBTInputAnalysis>_>::_M_erase_at_end
            (&this->inputs,
             (this->inputs).
             super__Vector_base<node::PSBTInputAnalysis,_std::allocator<node::PSBTInputAnalysis>_>.
             _M_impl.super__Vector_impl_data._M_start);
  this->next = CREATOR;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (&this->error,in_RSI);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SetInvalid(std::string err_msg)
    {
        estimated_vsize = std::nullopt;
        estimated_feerate = std::nullopt;
        fee = std::nullopt;
        inputs.clear();
        next = PSBTRole::CREATOR;
        error = err_msg;
    }